

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

void __thiscall relive::ReLiveDB::~ReLiveDB(ReLiveDB *this)

{
  ThreadPool *in_RDI;
  
  ghc::net::uri::~uri((uri *)&in_RDI[1].m_workQueue.m_queue);
  std::__cxx11::
  list<pearce::ThreadPool::TaskFuture<void>,_std::allocator<pearce::ThreadPool::TaskFuture<void>_>_>
  ::~list((list<pearce::ThreadPool::TaskFuture<void>,_std::allocator<pearce::ThreadPool::TaskFuture<void>_>_>
           *)0x167480);
  std::function<void_(int)>::~function((function<void_(int)> *)(in_RDI + 1));
  pearce::ThreadPool::~ThreadPool(in_RDI);
  return;
}

Assistant:

ReLiveDB::~ReLiveDB() {}